

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::Privkey::operator+=(Privkey *__return_storage_ptr__,Privkey *this,ByteData256 *right)

{
  Privkey *in_stack_ffffffffffffff88;
  Privkey *this_00;
  undefined1 local_40 [8];
  Privkey key;
  ByteData256 *right_local;
  Privkey *this_local;
  
  this_00 = __return_storage_ptr__;
  key._24_8_ = right;
  CreateTweakAdd((Privkey *)local_40,this,right);
  operator=(this_00,in_stack_ffffffffffffff88);
  Privkey(this_00,in_stack_ffffffffffffff88);
  ~Privkey((Privkey *)0x4520af);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::operator+=(const ByteData256 &right) {
  Privkey key = CreateTweakAdd(right);
  *this = key;
  return *this;
}